

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsHeader.cpp
# Opt level: O0

void __thiscall KDReports::Header::setDefaultFont(Header *this,QFont *font)

{
  pointer pHVar1;
  QTextDocument *pQVar2;
  QFont local_28 [8];
  QFont f;
  QFont *font_local;
  Header *this_local;
  
  QFont::QFont(local_28,font);
  QFont::setStyleStrategy((StyleStrategy)local_28);
  pHVar1 = std::unique_ptr<KDReports::HeaderPrivate,_std::default_delete<KDReports::HeaderPrivate>_>
           ::operator->(&this->d);
  pQVar2 = TextDocument::contentDocument(&pHVar1->m_textDocument);
  QTextDocument::setDefaultFont((QFont *)pQVar2);
  pHVar1 = std::unique_ptr<KDReports::HeaderPrivate,_std::default_delete<KDReports::HeaderPrivate>_>
           ::operator->(&this->d);
  ReportBuilder::setDefaultFont(&(pHVar1->m_builder).super_ReportBuilder,local_28);
  QFont::~QFont(local_28);
  return;
}

Assistant:

void KDReports::Header::setDefaultFont(const QFont &font)
{
    QFont f(font);
    f.setStyleStrategy(QFont::ForceOutline); // bitmap fonts look awful in printed documents
    d->m_textDocument.contentDocument().setDefaultFont(f);
    d->m_builder.setDefaultFont(f);
}